

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

void Unr_ManSetup_rec(Unr_Man_t *p,int iObj,int iTent,Vec_Int_t *vRoots)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  
  if (iObj < 0) goto LAB_00543072;
  if (p->vTents->nSize <= iObj) goto LAB_00543072;
  piVar1 = p->vTents->pArray;
  if (-1 < piVar1[(uint)iObj]) {
    return;
  }
  piVar1[(uint)iObj] = iTent;
  if (p->pGia->nObjs <= iObj) {
LAB_00543091:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = p->pGia->pObjs;
  uVar9 = (uint)*(undefined8 *)(pGVar2 + (uint)iObj);
  if ((~uVar9 & 0x1fffffff) != 0) {
    uVar9 = uVar9 & 0x1fffffff;
    Unr_ManSetup_rec(p,iObj - uVar9,iTent,vRoots);
    uVar9 = iObj - uVar9;
    if (((int)uVar9 < 0) || (p->vTents->nSize <= (int)uVar9)) goto LAB_00543072;
    if (p->vRanks->nSize <= (int)uVar9) goto LAB_005430b0;
    iVar5 = ~p->vTents->pArray[uVar9] + iTent;
    piVar1 = p->vRanks->pArray;
    iVar6 = piVar1[uVar9];
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = 0;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    piVar1[uVar9] = iVar6;
  }
  uVar3 = *(undefined8 *)(pGVar2 + (uint)iObj);
  uVar9 = (uint)uVar3;
  uVar7 = (uint)((ulong)uVar3 >> 0x20);
  if ((~uVar9 & 0x1fffffff) == 0 || (int)uVar9 < 0) {
    if (((uVar9 & 0x9fffffff) == 0x9fffffff) &&
       (pGVar4 = p->pGia, pGVar4->vCis->nSize - pGVar4->nRegs <= (int)(uVar7 & 0x1fffffff))) {
      iVar6 = pGVar4->vCis->nSize;
      if ((int)(uVar7 & 0x1fffffff) < iVar6 - pGVar4->nRegs) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar5 = pGVar4->vCos->nSize;
      uVar9 = (iVar5 - iVar6) + (uVar7 & 0x1fffffff);
      if (((int)uVar9 < 0) || (iVar5 <= (int)uVar9)) goto LAB_00543072;
      iVar6 = pGVar4->vCos->pArray[uVar9];
      lVar8 = (long)iVar6;
      if ((lVar8 < 0) || (pGVar4->nObjs <= iVar6)) goto LAB_00543091;
      Vec_IntPush(vRoots,iVar6);
      if (p->vRanks->nSize <= iVar6) goto LAB_005430b0;
      piVar1 = p->vRanks->pArray;
      iVar6 = piVar1[lVar8];
      iVar5 = 0;
      if (0 < iVar6) {
        iVar5 = iVar6;
      }
      piVar1[lVar8] = iVar5;
    }
  }
  else {
    Unr_ManSetup_rec(p,iObj - (uVar7 & 0x1fffffff),iTent,vRoots);
    uVar9 = iObj - (uVar7 & 0x1fffffff);
    if (((int)uVar9 < 0) || (p->vTents->nSize <= (int)uVar9)) {
LAB_00543072:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (p->vRanks->nSize <= (int)uVar9) {
LAB_005430b0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcUnroll.c"
                    ,0x75,"void Vec_IntWriteMaxEntry(Vec_Int_t *, int, int)");
    }
    iVar5 = ~p->vTents->pArray[uVar9] + iTent;
    piVar1 = p->vRanks->pArray;
    iVar6 = piVar1[uVar9];
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = 0;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    piVar1[uVar9] = iVar6;
  }
  Vec_IntPush(p->vOrder,iObj);
  return;
}

Assistant:

void Unr_ManSetup_rec( Unr_Man_t * p, int iObj, int iTent, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    int iFanin;
    if ( Vec_IntEntry(p->vTents, iObj) >= 0 )
        return;
    Vec_IntWriteEntry(p->vTents, iObj, iTent);
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId0(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Unr_ManSetup_rec( p, (iFanin = Gia_ObjFaninId1(pObj, iObj)), iTent, vRoots );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, Abc_MaxInt(0, iTent - Vec_IntEntry(p->vTents, iFanin) - 1) );
    }
    else if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        Vec_IntPush( vRoots, (iFanin = Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj))) );
        Vec_IntWriteMaxEntry( p->vRanks, iFanin, 0 );
    }
    Vec_IntPush( p->vOrder, iObj );
}